

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

void __thiscall
leveldb::log::Reader::Reader
          (Reader *this,SequentialFile *file,Reporter *reporter,bool checksum,
          uint64_t initial_offset)

{
  void *pvVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(byte *)(in_RDI + 2) = in_CL & 1;
  pvVar1 = operator_new__(0x8000);
  in_RDI[3] = pvVar1;
  Slice::Slice((Slice *)(in_RDI + 4));
  *(undefined1 *)(in_RDI + 6) = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = in_R8;
  *(bool *)(in_RDI + 10) = in_R8 != 0;
  return;
}

Assistant:

Reader::Reader(SequentialFile* file, Reporter* reporter, bool checksum,
               uint64_t initial_offset)
    : file_(file),
      reporter_(reporter),
      checksum_(checksum),
      backing_store_(new char[kBlockSize]),
      buffer_(),
      eof_(false),
      last_record_offset_(0),
      end_of_buffer_offset_(0),
      initial_offset_(initial_offset),
      resyncing_(initial_offset > 0) {}